

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_vtab_rhs_value(sqlite3_index_info *pIdxInfo,int iCons,sqlite3_value **ppVal)

{
  Expr *pExpr;
  int iVar1;
  int iVar2;
  sqlite3_value *psVar3;
  ValueNewStat4Ctx *in_R9;
  sqlite3_index_constraint_usage **ppVal_00;
  
  iVar1 = 0x15;
  if (-1 < iCons) {
    if (iCons < pIdxInfo->nConstraint) {
      ppVal_00 = &pIdxInfo[1].aConstraintUsage + (uint)iCons;
      iVar1 = 0;
      if ((*ppVal_00 == (sqlite3_index_constraint_usage *)0x0) &&
         (pExpr = *(Expr **)(*(long *)(*(long *)(*(long *)(pIdxInfo + 1) + 0x20) +
                                      (long)pIdxInfo->aConstraint[(uint)iCons].iTermOffset * 0x38) +
                            0x18), iVar1 = 0, pExpr != (Expr *)0x0)) {
        iVar1 = valueFromExpr(*(sqlite3 **)pIdxInfo[1].aConstraint,pExpr,
                              (*(sqlite3 **)pIdxInfo[1].aConstraint)->enc,'A',
                              (sqlite3_value **)ppVal_00,in_R9);
      }
      psVar3 = (sqlite3_value *)*ppVal_00;
      goto LAB_0013f47a;
    }
  }
  psVar3 = (sqlite3_value *)0x0;
LAB_0013f47a:
  *ppVal = psVar3;
  iVar2 = 0xc;
  if (psVar3 != (sqlite3_value *)0x0) {
    iVar2 = iVar1;
  }
  if (iVar1 != 0) {
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

SQLITE_API int sqlite3_vtab_rhs_value(
  sqlite3_index_info *pIdxInfo,   /* Copy of first argument to xBestIndex */
  int iCons,                      /* Constraint for which RHS is wanted */
  sqlite3_value **ppVal           /* Write value extracted here */
){
  HiddenIndexInfo *pH = (HiddenIndexInfo*)&pIdxInfo[1];
  sqlite3_value *pVal = 0;
  int rc = SQLITE_OK;
  if( iCons<0 || iCons>=pIdxInfo->nConstraint ){
    rc = SQLITE_MISUSE; /* EV: R-30545-25046 */
  }else{
    if( pH->aRhs[iCons]==0 ){
      WhereTerm *pTerm = &pH->pWC->a[pIdxInfo->aConstraint[iCons].iTermOffset];
      rc = sqlite3ValueFromExpr(
          pH->pParse->db, pTerm->pExpr->pRight, ENC(pH->pParse->db),
          SQLITE_AFF_BLOB, &pH->aRhs[iCons]
      );
      testcase( rc!=SQLITE_OK );
    }
    pVal = pH->aRhs[iCons];
  }
  *ppVal = pVal;

  if( rc==SQLITE_OK && pVal==0 ){  /* IMP: R-19933-32160 */
    rc = SQLITE_NOTFOUND;          /* IMP: R-36424-56542 */
  }

  return rc;
}